

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

OPJ_BOOL opj_t1_decode_cblks(opj_t1_t *t1,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp)

{
  long *plVar1;
  long lVar2;
  byte *pbVar3;
  byte bVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  opj_tcd_cblk_enc_t *poVar7;
  opj_mqc_t *mqc;
  opj_raw_t *raw;
  long *plVar8;
  opj_raw_t *raw_00;
  opj_mqc_t *poVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  OPJ_BOOL OVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  OPJ_INT32 OVar16;
  OPJ_UINT32 OVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  OPJ_INT32 *pOVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ushort uVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  OPJ_INT32 *pOVar35;
  uint uVar36;
  opj_tcd_band_t *poVar37;
  opj_mqc_t *poVar38;
  ushort *puVar39;
  byte bVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  int *piVar45;
  ushort uVar46;
  uint uVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  OPJ_UINT32 OVar52;
  ulong uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  uint *puVar59;
  opj_flag_t *poVar60;
  ulong uVar61;
  ulong uVar62;
  bool bVar63;
  opj_flag_t *local_170;
  OPJ_INT32 *local_168;
  OPJ_INT32 *local_160;
  OPJ_INT32 *local_140;
  byte local_110;
  uint local_d4;
  
  uVar10 = tilec->minimum_num_resolutions;
  if (uVar10 != 0) {
    uVar23 = tilec->x1 - tilec->x0;
    uVar49 = 0;
    do {
      poVar5 = tilec->resolutions;
      uVar30 = poVar5[uVar49].numbands;
      if (uVar30 != 0) {
        uVar10 = (int)uVar49 - 1;
        OVar11 = poVar5[uVar49].pw;
        OVar52 = poVar5[uVar49].ph;
        uVar53 = 0;
        do {
          if (OVar52 * OVar11 != 0) {
            poVar37 = poVar5[uVar49].bands + uVar53;
            uVar62 = 0;
            do {
              poVar6 = poVar37->precincts;
              if (poVar6[uVar62].ch * poVar6[uVar62].cw != 0) {
                uVar61 = 0;
                do {
                  poVar7 = poVar6[uVar62].cblks.enc;
                  OVar11 = poVar37->bandno;
                  iVar14 = tccp->roishift;
                  uVar30 = tccp->cblksty;
                  mqc = t1->mqc;
                  raw = t1->raw;
                  OVar12 = opj_t1_allocate_buffers
                                     (t1,poVar7[uVar61].x0 - *(int *)&poVar7[uVar61].passes,
                                      poVar7[uVar61].y0 - *(int *)((long)&poVar7[uVar61].passes + 4)
                                     );
                  if (OVar12 == 0) {
                    return 0;
                  }
                  iVar15 = poVar7[uVar61].x1;
                  opj_mqc_resetstates(mqc);
                  opj_mqc_setstate(mqc,0x12,0,0x2e);
                  opj_mqc_setstate(mqc,0x11,0,3);
                  opj_mqc_setstate(mqc,0,0,4);
                  if (poVar7[uVar61].numpassesinlayers != 0) {
                    uVar41 = iVar15 + iVar14;
                    uVar13 = OVar11 << 8;
                    uVar36 = 2;
                    uVar28 = 0;
                    do {
                      plVar1 = (long *)((long)poVar7[uVar61].layers + uVar28 * 0x28);
                      plVar8 = (long *)*plVar1;
                      if ((poVar7[uVar61].x1 + -4 < (int)uVar41) || (1 < uVar36)) {
                        if (plVar8 != (long *)0x0) {
LAB_0012033d:
                          OVar12 = opj_mqc_init_dec(mqc,(OPJ_BYTE *)
                                                        ((ulong)*(uint *)(plVar1 + 1) + *plVar8),
                                                    *(OPJ_UINT32 *)((long)plVar1 + 0x14));
                          local_110 = 1;
                          if (OVar12 == 0) {
                            return 0;
                          }
                          goto LAB_00120361;
                        }
                      }
                      else if (plVar8 != (long *)0x0) {
                        if ((uVar30 & 1) == 0) goto LAB_0012033d;
                        opj_raw_init_dec(raw,(OPJ_BYTE *)((ulong)*(uint *)(plVar1 + 1) + *plVar8),
                                         *(OPJ_UINT32 *)((long)plVar1 + 0x14));
                        local_110 = 0;
LAB_00120361:
                        if ((0 < (int)uVar41) && ((int)plVar1[2] != 0)) {
                          local_d4 = 0;
                          do {
                            bVar40 = (byte)uVar41;
                            if (uVar36 == 2) {
                              uVar43 = (1 << (bVar40 & 0x1f)) >> 1 | 1 << (uVar41 & 0x1f);
                              poVar38 = t1->mqc;
                              if ((uVar30 & 8) == 0) {
                                local_168 = t1->data;
                                local_160 = (OPJ_INT32 *)(t1->flags + 1);
                                uVar56 = t1->h;
                                if (uVar56 < 4) {
                                  uVar19 = (ulong)t1->w;
                                  uVar18 = 0;
                                }
                                else {
                                  uVar55 = t1->w;
                                  uVar19 = (ulong)uVar55;
                                  uVar18 = 0;
                                  do {
                                    if (uVar55 == 0) {
                                      uVar55 = 0;
                                    }
                                    else {
                                      uVar58 = 0;
                                      do {
                                        pOVar35 = local_168 + uVar58;
                                        poVar60 = t1->flags;
                                        uVar56 = t1->flags_stride;
                                        uVar51 = uVar58 + 1;
                                        iVar14 = (int)uVar51;
                                        if (((poVar60[uVar56 * (uVar18 + 2) + iVar14] |
                                              poVar60[uVar56 * (uVar18 + 1) + iVar14] |
                                              poVar60[uVar56 * (uVar18 + 3) + iVar14] |
                                             poVar60[uVar56 * (uVar18 + 4) + iVar14]) & 0x50ffU) ==
                                            0) {
                                          poVar38->curctx = poVar38->ctxs + 0x11;
                                          OVar16 = opj_mqc_decode(poVar38);
                                          if (OVar16 != 0) {
                                            poVar38->curctx = poVar38->ctxs + 0x12;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            uVar56 = opj_mqc_decode(poVar38);
                                            uVar56 = uVar56 | OVar16 * 2;
                                            if (uVar56 < 4) {
                                              puVar59 = (uint *)(pOVar35 + t1->w * uVar56);
                                              puVar39 = (ushort *)
                                                        ((long)local_160 +
                                                        (uVar58 + t1->flags_stride * uVar56) * 2);
                                              iVar14 = 0;
                                              do {
                                                if (t1->h <= uVar56 + iVar14) break;
                                                puVar39 = puVar39 + t1->flags_stride;
                                                if (iVar14 == 0) {
                                                  poVar9 = t1->mqc;
                                                  uVar55 = *puVar39 >> 4 & 0xff;
                                                  poVar9->curctx =
                                                       poVar9->ctxs +
                                                                                                              
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [uVar55];
                                                  uVar54 = opj_mqc_decode(poVar9);
                                                  bVar40 = ""[uVar55];
                                                  uVar55 = -uVar43;
                                                  if (uVar54 == bVar40) {
                                                    uVar55 = uVar43;
                                                  }
                                                  *puVar59 = uVar55;
                                                  opj_t1_updateflags((opj_flag_t *)puVar39,
                                                                     uVar54 ^ bVar40,
                                                                     t1->flags_stride);
                                                  *(byte *)((long)puVar39 + 1) =
                                                       *(byte *)((long)puVar39 + 1) & 0xbf;
                                                }
                                                else {
                                                  opj_t1_dec_clnpass_step
                                                            (t1,(opj_flag_t *)puVar39,
                                                             (OPJ_INT32 *)puVar59,OVar11,uVar43);
                                                }
                                                puVar59 = puVar59 + t1->w;
                                                iVar15 = uVar56 + iVar14;
                                                iVar14 = iVar14 + 1;
                                              } while (iVar15 != 3);
                                            }
                                          }
                                        }
                                        else {
                                          poVar60 = (opj_flag_t *)
                                                    ((long)local_160 + (uVar58 + uVar56) * 2);
                                          opj_t1_dec_clnpass_step(t1,poVar60,pOVar35,OVar11,uVar43);
                                          pOVar35 = pOVar35 + t1->w;
                                          poVar60 = poVar60 + t1->flags_stride;
                                          opj_t1_dec_clnpass_step(t1,poVar60,pOVar35,OVar11,uVar43);
                                          uVar56 = t1->w;
                                          uVar55 = t1->flags_stride;
                                          opj_t1_dec_clnpass_step
                                                    (t1,poVar60 + uVar55,pOVar35 + uVar56,OVar11,
                                                     uVar43);
                                          opj_t1_dec_clnpass_step
                                                    (t1,poVar60 + uVar55 + t1->flags_stride,
                                                     pOVar35 + uVar56 + t1->w,OVar11,uVar43);
                                        }
                                        uVar55 = t1->w;
                                        uVar19 = (ulong)uVar55;
                                        uVar58 = uVar51;
                                      } while (uVar51 < uVar19);
                                      uVar56 = t1->h;
                                    }
                                    uVar18 = uVar18 + 4;
                                    local_168 = local_168 + uVar55 * 4;
                                    local_160 = (OPJ_INT32 *)
                                                ((long)local_160 +
                                                (ulong)(t1->flags_stride << 2) * 2);
                                  } while (uVar18 < (uVar56 & 0xfffffffc));
                                }
                                if ((int)uVar19 != 0) {
                                  uVar58 = 0;
                                  do {
                                    if (uVar18 < uVar56) {
                                      poVar60 = (opj_flag_t *)((long)local_160 + uVar58 * 2);
                                      pOVar35 = local_168 + uVar58;
                                      uVar55 = uVar18;
                                      do {
                                        poVar60 = poVar60 + t1->flags_stride;
                                        opj_t1_dec_clnpass_step(t1,poVar60,pOVar35,OVar11,uVar43);
                                        uVar19 = (ulong)t1->w;
                                        uVar56 = t1->h;
                                        pOVar35 = pOVar35 + uVar19;
                                        uVar55 = uVar55 + 1;
                                      } while (uVar55 < uVar56);
                                    }
                                    uVar58 = uVar58 + 1;
                                  } while (uVar58 < uVar19);
                                }
                              }
                              else {
                                uVar56 = t1->h;
                                if (uVar56 != 0) {
                                  uVar55 = t1->w;
                                  uVar18 = 0;
                                  iVar14 = 4;
                                  do {
                                    if (uVar55 == 0) {
                                      uVar55 = 0;
                                    }
                                    else {
                                      local_140._0_4_ = uVar18 | 3;
                                      uVar56 = 0;
                                      do {
                                        if ((uint)local_140 < t1->h) {
                                          poVar60 = t1->flags;
                                          OVar52 = t1->flags_stride;
                                          iVar15 = uVar56 + 1;
                                          bVar4 = 1;
                                          uVar55 = 0;
                                          bVar40 = 1;
                                          if (((((poVar60[OVar52 * (uVar18 + 1) + uVar56 + 1] &
                                                 0x50ffU) != 0) ||
                                               (uVar55 = 0, bVar40 = bVar4,
                                               (poVar60[OVar52 * (uVar18 + 2) + iVar15] & 0x50ffU)
                                               != 0)) ||
                                              (uVar55 = 0,
                                              (poVar60[OVar52 * (uint)local_140 + iVar15] & 0x50ffU)
                                              != 0)) ||
                                             ((poVar60[OVar52 * (uVar18 + 4) + iVar15] & 0x50b9U) !=
                                              0)) goto LAB_00120ac9;
                                          poVar38->curctx = poVar38->ctxs + 0x11;
                                          OVar16 = opj_mqc_decode(poVar38);
                                          if (OVar16 != 0) {
                                            poVar38->curctx = poVar38->ctxs + 0x12;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            uVar55 = opj_mqc_decode(poVar38);
                                            uVar55 = uVar55 | OVar16 * 2;
                                            bVar40 = 0;
                                            goto LAB_00120ac9;
                                          }
                                        }
                                        else {
                                          uVar55 = 0;
                                          bVar40 = 1;
LAB_00120ac9:
                                          uVar54 = uVar55 + uVar18;
                                          if (uVar54 < uVar18 + 4) {
                                            iVar15 = 0;
                                            do {
                                              uVar32 = uVar54 + iVar15;
                                              if (t1->h <= uVar32) break;
                                              OVar52 = t1->w;
                                              puVar39 = (ushort *)
                                                        (t1->flags +
                                                        ((uVar54 + iVar15 + 1) * t1->flags_stride +
                                                        uVar56 + 1));
                                              uVar46 = *puVar39 & 0xfbb9;
                                              uVar29 = *puVar39;
                                              if (uVar32 == t1->h - 1) {
                                                uVar29 = uVar46;
                                              }
                                              poVar9 = t1->mqc;
                                              pOVar35 = t1->data;
                                              if (3 - uVar55 == iVar15) {
                                                uVar29 = uVar46;
                                              }
                                              if ((bool)(~bVar40 & iVar15 == 0)) {
LAB_00120bb2:
                                                uVar33 = uVar29 >> 4 & 0xff;
                                                poVar9->curctx =
                                                     poVar9->ctxs +
                                                                                                          
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [uVar33];
                                                uVar42 = opj_mqc_decode(poVar9);
                                                bVar4 = ""[uVar33];
                                                uVar33 = -uVar43;
                                                if (uVar42 == bVar4) {
                                                  uVar33 = uVar43;
                                                }
                                                pOVar35[OVar52 * uVar32 + uVar56] = uVar33;
                                                opj_t1_updateflags((opj_flag_t *)puVar39,
                                                                   uVar42 ^ bVar4,t1->flags_stride);
                                              }
                                              else if ((uVar29 & 0x5000) == 0) {
                                                poVar9->curctx =
                                                     poVar9->ctxs + ""[uVar29 & 0xff | uVar13];
                                                OVar16 = opj_mqc_decode(poVar9);
                                                if (OVar16 != 0) goto LAB_00120bb2;
                                              }
                                              *(byte *)((long)puVar39 + 1) =
                                                   *(byte *)((long)puVar39 + 1) & 0xbf;
                                              iVar15 = iVar15 + 1;
                                            } while (iVar14 - uVar54 != iVar15);
                                          }
                                        }
                                        uVar56 = uVar56 + 1;
                                        uVar55 = t1->w;
                                      } while (uVar56 < uVar55);
                                      uVar56 = t1->h;
                                    }
                                    uVar18 = uVar18 + 4;
                                    iVar14 = iVar14 + 4;
                                  } while (uVar18 < uVar56);
                                }
                              }
                              if ((uVar30 & 0x20) != 0) {
                                poVar38->curctx = poVar38->ctxs + 0x12;
                                opj_mqc_decode(poVar38);
                                opj_mqc_decode(poVar38);
                                opj_mqc_decode(poVar38);
                                opj_mqc_decode(poVar38);
                              }
LAB_00121a9e:
                              if (((byte)uVar30 >> 1 & local_110) != 0) {
                                opj_mqc_resetstates(mqc);
                                opj_mqc_setstate(mqc,0x12,0,0x2e);
                                opj_mqc_setstate(mqc,0x11,0,3);
                                opj_mqc_setstate(mqc,0,0,4);
                              }
                            }
                            else {
                              if (uVar36 != 1) {
                                if (local_110 == 0) {
                                  uVar43 = t1->h;
                                  if (uVar43 == 0) goto LAB_00121af6;
                                  uVar54 = (1 << (bVar40 & 0x1f)) >> 1 | 1 << (uVar41 & 0x1f);
                                  uVar56 = t1->w;
                                  uVar55 = uVar56;
                                  uVar18 = 0;
                                  do {
                                    uVar32 = uVar18 + 4;
                                    if (uVar56 == 0) {
                                      uVar56 = 0;
                                    }
                                    else {
                                      uVar56 = uVar55;
                                      uVar43 = 0;
                                      do {
                                        uVar55 = uVar43 + 1;
                                        if (uVar18 != 0xfffffffc) {
                                          iVar14 = 3;
                                          uVar56 = uVar18;
                                          do {
                                            if (t1->h <= uVar56) break;
                                            bVar63 = true;
                                            if ((uVar30 & 8) != 0) {
                                              if (iVar14 == 0) {
                                                bVar63 = false;
                                              }
                                              else {
                                                bVar63 = uVar56 != t1->h - 1;
                                              }
                                            }
                                            uVar42 = uVar56 + 1;
                                            uVar33 = t1->flags_stride * uVar42 + uVar55;
                                            uVar29 = t1->flags[uVar33];
                                            uVar46 = uVar29 & 0xfbb9;
                                            if (bVar63) {
                                              uVar46 = uVar29;
                                            }
                                            if ((uVar46 & 0x5000) == 0 && (char)uVar46 != '\0') {
                                              poVar60 = t1->flags + uVar33;
                                              raw_00 = t1->raw;
                                              pOVar35 = t1->data;
                                              OVar52 = t1->w;
                                              OVar17 = opj_raw_decode(raw_00);
                                              if (OVar17 != 0) {
                                                OVar17 = opj_raw_decode(raw_00);
                                                uVar33 = -uVar54;
                                                if (OVar17 == 0) {
                                                  uVar33 = uVar54;
                                                }
                                                pOVar35[uVar56 * OVar52 + uVar43] = uVar33;
                                                opj_t1_updateflags(poVar60,OVar17,t1->flags_stride);
                                              }
                                              pbVar3 = (byte *)((long)poVar60 + 1);
                                              *pbVar3 = *pbVar3 | 0x40;
                                            }
                                            iVar14 = iVar14 + -1;
                                            uVar56 = uVar42;
                                          } while (uVar42 < uVar32);
                                          uVar56 = t1->w;
                                        }
                                        uVar43 = uVar55;
                                      } while (uVar55 < uVar56);
                                      uVar43 = t1->h;
                                      uVar55 = uVar56;
                                    }
                                    uVar18 = uVar32;
                                  } while (uVar32 < uVar43);
                                }
                                else if ((uVar30 & 8) == 0) {
                                  local_140 = t1->data;
                                  local_170 = t1->flags + 1;
                                  uVar56 = (1 << (bVar40 & 0x1f)) >> 1 | 1 << (uVar41 & 0x1f);
                                  uVar43 = t1->h;
                                  uVar19 = (ulong)uVar13;
                                  if (uVar43 < 4) {
                                    uVar58 = (ulong)t1->w;
                                    uVar54 = 0;
                                  }
                                  else {
                                    uVar18 = -uVar56;
                                    uVar55 = t1->w;
                                    uVar58 = (ulong)uVar55;
                                    uVar54 = 0;
                                    do {
                                      if (uVar55 == 0) {
                                        uVar55 = 0;
                                      }
                                      else {
                                        lVar48 = 0;
                                        uVar51 = 0;
                                        do {
                                          uVar44 = (ulong)t1->flags_stride;
                                          poVar38 = t1->mqc;
                                          uVar29 = *(ushort *)
                                                    ((long)local_170 + lVar48 + uVar44 * 2);
                                          uVar21 = uVar58;
                                          uVar58 = uVar44;
                                          if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                            poVar38->curctx =
                                                 poVar38->ctxs + ""[(ulong)uVar29 & 0xff | uVar19];
                                            OVar16 = opj_mqc_decode(poVar38);
                                            if (OVar16 != 0) {
                                              bVar40 = (byte)(uVar29 >> 4);
                                              poVar38->curctx =
                                                   poVar38->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [bVar40];
                                              uVar55 = opj_mqc_decode(poVar38);
                                              bVar40 = ""[bVar40];
                                              uVar43 = uVar18;
                                              if (uVar55 == bVar40) {
                                                uVar43 = uVar56;
                                              }
                                              *(uint *)((long)local_140 + lVar48 * 2) = uVar43;
                                              opj_t1_updateflags((opj_flag_t *)
                                                                 (lVar48 + uVar44 * 2 +
                                                                 (long)local_170),uVar55 ^ bVar40,
                                                                 t1->flags_stride);
                                            }
                                            pbVar3 = (byte *)((long)local_170 +
                                                             lVar48 + uVar44 * 2 + 1);
                                            *pbVar3 = *pbVar3 | 0x40;
                                            poVar38 = t1->mqc;
                                            uVar21 = (ulong)t1->w;
                                            uVar58 = (ulong)t1->flags_stride;
                                          }
                                          lVar50 = uVar44 * 2 + uVar58 * 2;
                                          uVar29 = *(ushort *)((long)local_170 + lVar48 + lVar50);
                                          uVar20 = uVar21;
                                          uVar26 = uVar58;
                                          if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                            poVar38->curctx =
                                                 poVar38->ctxs + ""[(ulong)uVar29 & 0xff | uVar19];
                                            OVar16 = opj_mqc_decode(poVar38);
                                            if (OVar16 != 0) {
                                              bVar40 = (byte)(uVar29 >> 4);
                                              poVar38->curctx =
                                                   poVar38->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [bVar40];
                                              uVar55 = opj_mqc_decode(poVar38);
                                              bVar40 = ""[bVar40];
                                              uVar43 = uVar18;
                                              if (uVar55 == bVar40) {
                                                uVar43 = uVar56;
                                              }
                                              *(uint *)((long)local_140 + lVar48 * 2 + uVar21 * 4) =
                                                   uVar43;
                                              opj_t1_updateflags((opj_flag_t *)
                                                                 ((long)local_170 + lVar50 + lVar48)
                                                                 ,uVar55 ^ bVar40,t1->flags_stride);
                                            }
                                            pbVar3 = (byte *)((long)local_170 + lVar48 + lVar50 + 1)
                                            ;
                                            *pbVar3 = *pbVar3 | 0x40;
                                            poVar38 = t1->mqc;
                                            uVar20 = (ulong)t1->w;
                                            uVar26 = (ulong)t1->flags_stride;
                                          }
                                          lVar50 = uVar26 * 2 + uVar58 * 2;
                                          lVar2 = lVar50 + uVar44 * 2;
                                          uVar29 = *(ushort *)((long)local_170 + lVar48 + lVar2);
                                          uVar58 = uVar20;
                                          if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                            poVar38->curctx =
                                                 poVar38->ctxs + ""[(ulong)uVar29 & 0xff | uVar19];
                                            OVar16 = opj_mqc_decode(poVar38);
                                            if (OVar16 != 0) {
                                              bVar40 = (byte)(uVar29 >> 4);
                                              poVar38->curctx =
                                                   poVar38->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [bVar40];
                                              uVar55 = opj_mqc_decode(poVar38);
                                              bVar40 = ""[bVar40];
                                              uVar43 = uVar18;
                                              if (uVar55 == bVar40) {
                                                uVar43 = uVar56;
                                              }
                                              *(uint *)((long)local_140 +
                                                       lVar48 * 2 + uVar21 * 4 + uVar20 * 4) =
                                                   uVar43;
                                              opj_t1_updateflags((opj_flag_t *)
                                                                 ((long)local_170 + lVar2 + lVar48),
                                                                 uVar55 ^ bVar40,t1->flags_stride);
                                            }
                                            pbVar3 = (byte *)((long)local_170 + lVar48 + lVar2 + 1);
                                            *pbVar3 = *pbVar3 | 0x40;
                                            uVar26 = (ulong)t1->flags_stride;
                                            poVar38 = t1->mqc;
                                            uVar58 = (ulong)t1->w;
                                          }
                                          lVar50 = lVar50 + uVar26 * 2 + uVar44 * 2;
                                          uVar29 = *(ushort *)((long)local_170 + lVar48 + lVar50);
                                          if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                            poVar38->curctx =
                                                 poVar38->ctxs + ""[(ulong)uVar29 & 0xff | uVar19];
                                            OVar16 = opj_mqc_decode(poVar38);
                                            if (OVar16 != 0) {
                                              bVar40 = (byte)(uVar29 >> 4);
                                              poVar38->curctx =
                                                   poVar38->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [bVar40];
                                              uVar55 = opj_mqc_decode(poVar38);
                                              bVar40 = ""[bVar40];
                                              uVar43 = uVar18;
                                              if (uVar55 == bVar40) {
                                                uVar43 = uVar56;
                                              }
                                              *(uint *)((long)local_140 +
                                                       lVar48 * 2 +
                                                       uVar20 * 4 + uVar58 * 4 + uVar21 * 4) =
                                                   uVar43;
                                              opj_t1_updateflags((opj_flag_t *)
                                                                 ((long)local_170 + lVar50 + lVar48)
                                                                 ,uVar55 ^ bVar40,t1->flags_stride);
                                            }
                                            pbVar3 = (byte *)((long)local_170 + lVar48 + lVar50 + 1)
                                            ;
                                            *pbVar3 = *pbVar3 | 0x40;
                                            uVar58 = (ulong)t1->w;
                                          }
                                          uVar51 = uVar51 + 1;
                                          uVar55 = (uint)uVar58;
                                          lVar48 = lVar48 + 2;
                                        } while (uVar51 < uVar58);
                                        uVar43 = t1->h;
                                      }
                                      local_140 = local_140 + uVar55 * 4;
                                      local_170 = local_170 + (t1->flags_stride << 2);
                                      uVar54 = uVar54 + 4;
                                    } while (uVar54 < (uVar43 & 0xfffffffc));
                                  }
                                  if ((int)uVar58 != 0) {
                                    uVar51 = 0;
                                    do {
                                      if (uVar54 < uVar43) {
                                        puVar39 = (ushort *)(local_170 + uVar51);
                                        puVar59 = (uint *)(local_140 + uVar51);
                                        uVar55 = uVar54;
                                        do {
                                          puVar39 = puVar39 + t1->flags_stride;
                                          uVar29 = *puVar39;
                                          if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                            poVar38 = t1->mqc;
                                            poVar38->curctx =
                                                 poVar38->ctxs + ""[(ulong)uVar29 & 0xff | uVar19];
                                            OVar16 = opj_mqc_decode(poVar38);
                                            if (OVar16 != 0) {
                                              bVar40 = (byte)(uVar29 >> 4);
                                              poVar38->curctx =
                                                   poVar38->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [bVar40];
                                              uVar18 = opj_mqc_decode(poVar38);
                                              bVar40 = ""[bVar40];
                                              uVar43 = -uVar56;
                                              if (uVar18 == bVar40) {
                                                uVar43 = uVar56;
                                              }
                                              *puVar59 = uVar43;
                                              opj_t1_updateflags((opj_flag_t *)puVar39,
                                                                 uVar18 ^ bVar40,t1->flags_stride);
                                            }
                                            *(byte *)((long)puVar39 + 1) =
                                                 *(byte *)((long)puVar39 + 1) | 0x40;
                                            uVar58 = (ulong)t1->w;
                                            uVar43 = t1->h;
                                          }
                                          puVar59 = puVar59 + uVar58;
                                          uVar55 = uVar55 + 1;
                                        } while (uVar55 < uVar43);
                                      }
                                      uVar51 = uVar51 + 1;
                                    } while (uVar51 < uVar58);
                                  }
                                }
                                else {
                                  uVar43 = t1->h;
                                  if (uVar43 != 0) {
                                    uVar54 = (1 << (bVar40 & 0x1f)) >> 1 | 1 << (uVar41 & 0x1f);
                                    uVar56 = t1->w;
                                    uVar55 = uVar56;
                                    uVar18 = 0;
                                    do {
                                      uVar32 = uVar18 + 4;
                                      if (uVar55 == 0) {
                                        uVar55 = 0;
                                      }
                                      else {
                                        uVar43 = 0;
                                        do {
                                          uVar55 = uVar43 + 1;
                                          if (uVar18 != 0xfffffffc) {
                                            iVar14 = 3;
                                            uVar33 = uVar18;
                                            do {
                                              uVar56 = t1->w;
                                              if (t1->h <= uVar33) goto LAB_00121489;
                                              uVar57 = uVar33 + 1;
                                              uVar24 = t1->flags_stride * uVar57 + uVar55;
                                              uVar42 = (uint)(ushort)t1->flags[uVar24];
                                              uVar47 = uVar42 & 0xfffffbb9;
                                              if (uVar33 == t1->h - 1) {
                                                uVar42 = uVar47;
                                              }
                                              bVar63 = iVar14 == 0;
                                              iVar14 = iVar14 + -1;
                                              if (bVar63) {
                                                uVar42 = uVar47;
                                              }
                                              if ((uVar42 & 0x5000) == 0 && (uVar42 & 0xff) != 0) {
                                                poVar60 = t1->flags + uVar24;
                                                poVar38 = t1->mqc;
                                                pOVar35 = t1->data;
                                                poVar38->curctx =
                                                     poVar38->ctxs + ""[uVar42 & 0xff | uVar13];
                                                OVar16 = opj_mqc_decode(poVar38);
                                                if (OVar16 != 0) {
                                                  uVar42 = uVar42 >> 4 & 0xff;
                                                  poVar38->curctx =
                                                       poVar38->ctxs +
                                                                                                              
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [uVar42];
                                                  uVar24 = opj_mqc_decode(poVar38);
                                                  bVar40 = ""[uVar42];
                                                  uVar42 = -uVar54;
                                                  if (uVar24 == bVar40) {
                                                    uVar42 = uVar54;
                                                  }
                                                  pOVar35[uVar56 * uVar33 + uVar43] = uVar42;
                                                  opj_t1_updateflags(poVar60,uVar24 ^ bVar40,
                                                                     t1->flags_stride);
                                                }
                                                pbVar3 = (byte *)((long)poVar60 + 1);
                                                *pbVar3 = *pbVar3 | 0x40;
                                              }
                                              uVar33 = uVar57;
                                            } while (uVar57 < uVar32);
                                            uVar56 = t1->w;
                                          }
LAB_00121489:
                                          uVar43 = uVar55;
                                        } while (uVar55 < uVar56);
                                        uVar43 = t1->h;
                                        uVar55 = uVar56;
                                      }
                                      uVar18 = uVar32;
                                    } while (uVar32 < uVar43);
                                  }
                                }
                                goto LAB_00121a9e;
                              }
                              if (local_110 != 0) {
                                if ((uVar30 & 8) == 0) {
                                  local_160 = t1->data;
                                  poVar60 = t1->flags + 1;
                                  iVar14 = (1 << (bVar40 & 0x1f)) >> 1;
                                  iVar15 = -iVar14;
                                  uVar43 = t1->h;
                                  uVar55 = 0;
                                  uVar56 = t1->w;
                                  uVar19 = (ulong)uVar56;
                                  if (3 < uVar43) {
                                    uVar55 = 0;
                                    do {
                                      if (uVar56 == 0) {
                                        uVar56 = 0;
                                      }
                                      else {
                                        uVar58 = 0;
                                        do {
                                          uVar44 = (ulong)t1->flags_stride;
                                          uVar29 = poVar60[uVar44 + uVar58];
                                          uVar51 = uVar19;
                                          uVar21 = uVar44;
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar38 = t1->mqc;
                                            uVar19 = (ulong)(0xf - ((char)uVar29 == '\0'));
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar19 = 0x10;
                                            }
                                            poVar38->curctx = poVar38->ctxs + uVar19;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            iVar25 = iVar14;
                                            if (OVar16 == 0) {
                                              iVar25 = iVar15;
                                            }
                                            iVar31 = -iVar25;
                                            if (-1 < local_160[uVar58]) {
                                              iVar31 = iVar25;
                                            }
                                            local_160[uVar58] = iVar31 + local_160[uVar58];
                                            pbVar3 = (byte *)((long)poVar60 +
                                                             uVar58 * 2 + uVar44 * 2 + 1);
                                            *pbVar3 = *pbVar3 | 0x20;
                                            uVar51 = (ulong)t1->w;
                                            uVar21 = (ulong)t1->flags_stride;
                                          }
                                          uVar29 = poVar60[uVar21 + uVar44 + uVar58];
                                          uVar20 = uVar51;
                                          uVar26 = uVar21;
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar38 = t1->mqc;
                                            uVar19 = (ulong)(0xf - ((char)uVar29 == '\0'));
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar19 = 0x10;
                                            }
                                            poVar38->curctx = poVar38->ctxs + uVar19;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            iVar25 = iVar14;
                                            if (OVar16 == 0) {
                                              iVar25 = iVar15;
                                            }
                                            iVar31 = -iVar25;
                                            if (-1 < local_160[uVar51 + uVar58]) {
                                              iVar31 = iVar25;
                                            }
                                            local_160[uVar51 + uVar58] =
                                                 iVar31 + local_160[uVar51 + uVar58];
                                            pbVar3 = (byte *)((long)poVar60 +
                                                             uVar58 * 2 +
                                                             uVar44 * 2 + uVar21 * 2 + 1);
                                            *pbVar3 = *pbVar3 | 0x20;
                                            uVar20 = (ulong)t1->w;
                                            uVar26 = (ulong)t1->flags_stride;
                                          }
                                          lVar48 = uVar26 * 2 + uVar21 * 2;
                                          uVar29 = poVar60[uVar44 + uVar21 + uVar26 + uVar58];
                                          uVar19 = uVar20;
                                          uVar27 = uVar26;
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar38 = t1->mqc;
                                            uVar19 = (ulong)(0xf - ((char)uVar29 == '\0'));
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar19 = 0x10;
                                            }
                                            poVar38->curctx = poVar38->ctxs + uVar19;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            iVar25 = iVar14;
                                            if (OVar16 == 0) {
                                              iVar25 = iVar15;
                                            }
                                            iVar31 = -iVar25;
                                            if (-1 < local_160[uVar20 + uVar51 + uVar58]) {
                                              iVar31 = iVar25;
                                            }
                                            local_160[uVar20 + uVar51 + uVar58] =
                                                 iVar31 + local_160[uVar20 + uVar51 + uVar58];
                                            pbVar3 = (byte *)((long)poVar60 +
                                                             uVar58 * 2 + lVar48 + uVar44 * 2 + 1);
                                            *pbVar3 = *pbVar3 | 0x20;
                                            uVar19 = (ulong)t1->w;
                                            uVar27 = (ulong)t1->flags_stride;
                                          }
                                          uVar29 = poVar60[uVar44 + uVar27 + uVar21 + uVar26 + 
                                                  uVar58];
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar38 = t1->mqc;
                                            uVar21 = (ulong)(0xf - ((char)uVar29 == '\0'));
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar21 = 0x10;
                                            }
                                            poVar38->curctx = poVar38->ctxs + uVar21;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            iVar25 = iVar14;
                                            if (OVar16 == 0) {
                                              iVar25 = iVar15;
                                            }
                                            iVar31 = -iVar25;
                                            if (-1 < local_160[uVar19 + uVar20 + uVar51 + uVar58]) {
                                              iVar31 = iVar25;
                                            }
                                            local_160[uVar19 + uVar20 + uVar51 + uVar58] =
                                                 iVar31 + local_160[uVar19 + uVar20 + uVar51 + 
                                                  uVar58];
                                            pbVar3 = (byte *)((long)poVar60 +
                                                             uVar58 * 2 +
                                                             lVar48 + uVar27 * 2 + uVar44 * 2 + 1);
                                            *pbVar3 = *pbVar3 | 0x20;
                                            uVar19 = (ulong)t1->w;
                                          }
                                          uVar58 = uVar58 + 1;
                                          uVar56 = (uint)uVar19;
                                        } while (uVar58 < uVar19);
                                        uVar43 = t1->h;
                                      }
                                      local_160 = local_160 + uVar56 * 4;
                                      poVar60 = poVar60 + (t1->flags_stride << 2);
                                      uVar55 = uVar55 + 4;
                                    } while (uVar55 < (uVar43 & 0xfffffffc));
                                  }
                                  if ((int)uVar19 != 0) {
                                    uVar58 = 0;
                                    do {
                                      if (uVar55 < uVar43) {
                                        puVar39 = (ushort *)(poVar60 + uVar58);
                                        piVar45 = local_160 + uVar58;
                                        uVar56 = uVar55;
                                        do {
                                          puVar39 = puVar39 + t1->flags_stride;
                                          uVar29 = *puVar39;
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar38 = t1->mqc;
                                            uVar19 = (ulong)(0xf - ((char)uVar29 == '\0'));
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar19 = 0x10;
                                            }
                                            poVar38->curctx = poVar38->ctxs + uVar19;
                                            OVar16 = opj_mqc_decode(poVar38);
                                            iVar25 = iVar14;
                                            if (OVar16 == 0) {
                                              iVar25 = iVar15;
                                            }
                                            iVar31 = -iVar25;
                                            if (-1 < *piVar45) {
                                              iVar31 = iVar25;
                                            }
                                            *piVar45 = iVar31 + *piVar45;
                                            *(byte *)((long)puVar39 + 1) =
                                                 *(byte *)((long)puVar39 + 1) | 0x20;
                                            uVar19 = (ulong)t1->w;
                                            uVar43 = t1->h;
                                          }
                                          piVar45 = piVar45 + uVar19;
                                          uVar56 = uVar56 + 1;
                                        } while (uVar56 < uVar43);
                                      }
                                      uVar58 = uVar58 + 1;
                                    } while (uVar58 < uVar19);
                                  }
                                }
                                else {
                                  uVar43 = t1->h;
                                  if (uVar43 != 0) {
                                    iVar14 = (1 << (bVar40 & 0x1f)) >> 1;
                                    uVar56 = t1->w;
                                    uVar55 = uVar56;
                                    uVar18 = 0;
                                    do {
                                      uVar54 = uVar18 + 4;
                                      if (uVar56 == 0) {
                                        uVar56 = 0;
                                      }
                                      else {
                                        uVar56 = uVar55;
                                        uVar43 = 0;
                                        do {
                                          uVar55 = uVar43 + 1;
                                          if (uVar18 != 0xfffffffc) {
                                            iVar15 = 3;
                                            uVar56 = uVar18;
                                            do {
                                              if (t1->h <= uVar56) break;
                                              poVar60 = t1->flags;
                                              uVar42 = uVar56 + 1;
                                              uVar19 = (ulong)(t1->flags_stride * uVar42 + uVar55);
                                              uVar32 = (uint)(ushort)poVar60[uVar19];
                                              uVar33 = uVar32 & 0xfffffbb9;
                                              if (uVar56 == t1->h - 1) {
                                                uVar32 = uVar33;
                                              }
                                              bVar63 = iVar15 == 0;
                                              iVar15 = iVar15 + -1;
                                              if (bVar63) {
                                                uVar32 = uVar33;
                                              }
                                              if ((uVar32 & 0x5000) == 0x1000) {
                                                poVar38 = t1->mqc;
                                                pOVar35 = t1->data;
                                                uVar33 = uVar56 * t1->w + uVar43;
                                                uVar56 = 0xf - ((char)uVar32 == '\0');
                                                if ((uVar32 >> 0xd & 1) != 0) {
                                                  uVar56 = 0x10;
                                                }
                                                poVar38->curctx = poVar38->ctxs + uVar56;
                                                OVar16 = opj_mqc_decode(poVar38);
                                                iVar25 = iVar14;
                                                if (OVar16 == 0) {
                                                  iVar25 = -iVar14;
                                                }
                                                iVar31 = pOVar35[uVar33];
                                                iVar34 = -iVar25;
                                                if (-1 < iVar31) {
                                                  iVar34 = iVar25;
                                                }
                                                pOVar35[uVar33] = iVar34 + iVar31;
                                                pbVar3 = (byte *)((long)poVar60 + uVar19 * 2 + 1);
                                                *pbVar3 = *pbVar3 | 0x20;
                                              }
                                              uVar56 = uVar42;
                                            } while (uVar42 < uVar54);
                                            uVar56 = t1->w;
                                          }
                                          uVar43 = uVar55;
                                        } while (uVar55 < uVar56);
                                        uVar43 = t1->h;
                                        uVar55 = uVar56;
                                      }
                                      uVar18 = uVar54;
                                    } while (uVar54 < uVar43);
                                  }
                                }
                                goto LAB_00121a9e;
                              }
                              uVar43 = t1->h;
                              if (uVar43 != 0) {
                                iVar14 = (1 << (bVar40 & 0x1f)) >> 1;
                                uVar56 = t1->w;
                                uVar55 = uVar56;
                                uVar18 = 0;
                                do {
                                  uVar54 = uVar18 + 4;
                                  if (uVar56 == 0) {
                                    uVar56 = 0;
                                  }
                                  else {
                                    uVar56 = uVar55;
                                    uVar43 = 0;
                                    do {
                                      uVar32 = uVar43 + 1;
                                      uVar55 = uVar18;
                                      if (uVar18 != 0xfffffffc) {
                                        do {
                                          if (t1->h <= uVar55) break;
                                          poVar60 = t1->flags;
                                          uVar56 = uVar55 + 1;
                                          uVar19 = (ulong)(t1->flags_stride * uVar56 + uVar32);
                                          if ((poVar60[uVar19] & 0x5000U) == 0x1000) {
                                            pOVar35 = t1->data;
                                            uVar55 = uVar55 * t1->w + uVar43;
                                            OVar52 = opj_raw_decode(t1->raw);
                                            iVar15 = iVar14;
                                            if (OVar52 == 0) {
                                              iVar15 = -iVar14;
                                            }
                                            iVar25 = pOVar35[uVar55];
                                            iVar31 = -iVar15;
                                            if (-1 < iVar25) {
                                              iVar31 = iVar15;
                                            }
                                            pOVar35[uVar55] = iVar31 + iVar25;
                                            pbVar3 = (byte *)((long)poVar60 + uVar19 * 2 + 1);
                                            *pbVar3 = *pbVar3 | 0x20;
                                          }
                                          uVar55 = uVar56;
                                        } while (uVar56 < uVar54);
                                        uVar56 = t1->w;
                                      }
                                      uVar43 = uVar32;
                                    } while (uVar32 < uVar56);
                                    uVar43 = t1->h;
                                    uVar55 = uVar56;
                                  }
                                  uVar18 = uVar54;
                                } while (uVar54 < uVar43);
                                goto LAB_00121a9e;
                              }
                            }
LAB_00121af6:
                            uVar43 = uVar36 + 1;
                            uVar36 = uVar43;
                            if (uVar43 == 3) {
                              uVar36 = 0;
                            }
                            uVar41 = uVar41 - (uVar43 == 3);
                            local_d4 = local_d4 + 1;
                          } while ((local_d4 < *(uint *)(plVar1 + 2)) && (0 < (int)uVar41));
                        }
                      }
                      uVar28 = uVar28 + 1;
                    } while (uVar28 < poVar7[uVar61].numpassesinlayers);
                  }
                  iVar14 = *(int *)&poVar7[uVar61].passes - poVar37->x0;
                  if ((poVar37->bandno & 1) != 0) {
                    iVar14 = (iVar14 + tilec->resolutions[uVar10].x1) -
                             tilec->resolutions[uVar10].x0;
                  }
                  iVar15 = *(int *)((long)&poVar7[uVar61].passes + 4) - poVar37->y0;
                  if ((poVar37->bandno & 2) != 0) {
                    iVar15 = (iVar15 + tilec->resolutions[uVar10].y1) -
                             tilec->resolutions[uVar10].y0;
                  }
                  pOVar35 = t1->data;
                  uVar30 = t1->w;
                  uVar28 = (ulong)uVar30;
                  OVar11 = t1->h;
                  iVar25 = tccp->roishift;
                  if (iVar25 == 0) {
LAB_00121c55:
                    if (tccp->qmfbid == 1) {
                      if (OVar11 != 0) {
                        pOVar22 = tilec->data;
                        uVar19 = 0;
                        uVar58 = 0;
                        OVar52 = 0;
                        do {
                          iVar25 = (int)uVar19;
                          iVar31 = (int)uVar58;
                          for (uVar51 = uVar28; uVar51 != 0; uVar51 = uVar51 - 1) {
                            pOVar22[(iVar15 * uVar23 + iVar14) + uVar58] = pOVar35[uVar19] / 2;
                            uVar58 = (ulong)((int)uVar58 + 1);
                            uVar19 = (ulong)((int)uVar19 + 1);
                          }
                          OVar52 = OVar52 + 1;
                          uVar58 = (ulong)(iVar31 + uVar23);
                          uVar19 = (ulong)(iVar25 + uVar30);
                        } while (OVar52 != OVar11);
                      }
                    }
                    else if (OVar11 != 0) {
                      pOVar22 = tilec->data + (iVar15 * uVar23 + iVar14);
                      OVar52 = 0;
                      do {
                        if (uVar28 != 0) {
                          lVar48 = 0;
                          lVar50 = 0;
                          do {
                            pOVar22[lVar50] =
                                 (OPJ_INT32)((float)pOVar35[lVar50] * (float)poVar37->stepsize);
                            lVar50 = lVar50 + 1;
                            lVar48 = lVar48 + -4;
                          } while (uVar30 != (uint)lVar50);
                          pOVar35 = (OPJ_INT32 *)((long)pOVar35 - lVar48);
                        }
                        OVar52 = OVar52 + 1;
                        pOVar22 = pOVar22 + uVar23;
                      } while (OVar52 != OVar11);
                    }
                  }
                  else if (OVar11 != 0) {
                    uVar19 = 0;
                    OVar52 = 0;
                    do {
                      iVar31 = (int)uVar19;
                      for (uVar58 = uVar28; uVar58 != 0; uVar58 = uVar58 - 1) {
                        uVar36 = pOVar35[uVar19];
                        uVar41 = -uVar36;
                        if (0 < (int)uVar36) {
                          uVar41 = uVar36;
                        }
                        if (1 << ((byte)iVar25 & 0x1f) <= (int)uVar41) {
                          uVar41 = uVar41 >> ((byte)tccp->roishift & 0x1f);
                          uVar13 = -uVar41;
                          if (-1 < (int)uVar36) {
                            uVar13 = uVar41;
                          }
                          pOVar35[uVar19] = uVar13;
                        }
                        uVar19 = (ulong)((int)uVar19 + 1);
                      }
                      OVar52 = OVar52 + 1;
                      uVar19 = (ulong)(iVar31 + uVar30);
                    } while (OVar52 != OVar11);
                    goto LAB_00121c55;
                  }
                  uVar61 = uVar61 + 1;
                } while (uVar61 < poVar6[uVar62].ch * poVar6[uVar62].cw);
                OVar11 = poVar5[uVar49].pw;
                OVar52 = poVar5[uVar49].ph;
              }
              uVar62 = uVar62 + 1;
            } while (uVar62 < OVar52 * OVar11);
            uVar30 = poVar5[uVar49].numbands;
          }
          uVar53 = uVar53 + 1;
        } while (uVar53 < uVar30);
        uVar10 = tilec->minimum_num_resolutions;
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 < uVar10);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_t1_decode_cblks(   opj_t1_t* t1,
                            opj_tcd_tilecomp_t* tilec,
                            opj_tccp_t* tccp
                            )
{
	OPJ_UINT32 resno, bandno, precno, cblkno;
	OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

	for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
		opj_tcd_resolution_t* res = &tilec->resolutions[resno];

		for (bandno = 0; bandno < res->numbands; ++bandno) {
			opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

			for (precno = 0; precno < res->pw * res->ph; ++precno) {
				opj_tcd_precinct_t* precinct = &band->precincts[precno];

				for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
					opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
					OPJ_INT32* OPJ_RESTRICT datap;
					OPJ_UINT32 cblk_w, cblk_h;
					OPJ_INT32 x, y;
					OPJ_UINT32 i, j;

                    if (OPJ_FALSE == opj_t1_decode_cblk(
                                            t1,
                                            cblk,
                                            band->bandno,
                                            (OPJ_UINT32)tccp->roishift,
                                            tccp->cblksty)) {
                            return OPJ_FALSE;
                    }

					x = cblk->x0 - band->x0;
					y = cblk->y0 - band->y0;
					if (band->bandno & 1) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						x += pres->x1 - pres->x0;
					}
					if (band->bandno & 2) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						y += pres->y1 - pres->y0;
					}

					datap=t1->data;
					cblk_w = t1->w;
					cblk_h = t1->h;

					if (tccp->roishift) {
						OPJ_INT32 thresh = 1 << tccp->roishift;
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 val = datap[(j * cblk_w) + i];
								OPJ_INT32 mag = abs(val);
								if (mag >= thresh) {
									mag >>= tccp->roishift;
									datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
								}
							}
						}
					}
					if (tccp->qmfbid == 1) {
                        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 tmp = datap[(j * cblk_w) + i];
								((OPJ_INT32*)tiledp)[(j * tile_w) + i] = tmp/2;
							}
						}
					} else {		/* if (tccp->qmfbid == 0) */
                        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
                            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
							for (i = 0; i < cblk_w; ++i) {
                                OPJ_FLOAT32 tmp = (OPJ_FLOAT32)*datap * band->stepsize;
                                *tiledp2 = tmp;
                                datap++;
                                tiledp2++;
							}
                            tiledp += tile_w;
						}
					}
				} /* cblkno */
			} /* precno */
		} /* bandno */
	} /* resno */
        return OPJ_TRUE;
}